

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::makePointerDebugType(Builder *this,StorageClass storageClass,Id baseType)

{
  bool bVar1;
  Id id;
  Id IVar2;
  Id typeId;
  Id IVar3;
  mapped_type_conflict *pmVar4;
  mapped_type *pmVar5;
  reference ppIVar6;
  Instruction *pIVar7;
  value_type local_68;
  key_type local_5c;
  Instruction *local_58;
  Instruction *type;
  Instruction *otherType;
  iterator __end1;
  iterator __begin1;
  mapped_type *__range1;
  Id scID;
  Id debugBaseType;
  Id baseType_local;
  StorageClass storageClass_local;
  Builder *this_local;
  
  scID = baseType;
  debugBaseType = storageClass;
  _baseType_local = this;
  pmVar4 = std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&this->debugId,&scID);
  IVar3 = *pmVar4;
  if (IVar3 == 0) {
    this_local._4_4_ = makeDebugInfoNone(this);
  }
  else {
    id = makeUintConstant(this,debugBaseType,false);
    __begin1._M_current._4_4_ = 3;
    pmVar5 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedDebugTypes,(key_type *)((long)&__begin1._M_current + 4));
    __end1 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::begin(pmVar5);
    otherType = (Instruction *)
                std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::end(pmVar5);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<spv::Instruction_**,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>
                                       *)&otherType), bVar1) {
      ppIVar6 = __gnu_cxx::
                __normal_iterator<spv::Instruction_**,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>
                ::operator*(&__end1);
      type = *ppIVar6;
      IVar2 = spv::Instruction::getIdOperand(type,2);
      if ((IVar2 == IVar3) && (IVar2 = spv::Instruction::getIdOperand(type,3), IVar2 == id)) {
        IVar3 = spv::Instruction::getResultId(type);
        return IVar3;
      }
      __gnu_cxx::
      __normal_iterator<spv::Instruction_**,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>
      ::operator++(&__end1);
    }
    pIVar7 = (Instruction *)::operator_new(0x60);
    IVar2 = getUniqueId(this);
    typeId = makeVoidType(this);
    spv::Instruction::Instruction(pIVar7,IVar2,typeId,OpExtInst);
    local_58 = pIVar7;
    spv::Instruction::reserveOperands(pIVar7,5);
    spv::Instruction::addIdOperand(local_58,this->nonSemanticShaderDebugInfo);
    spv::Instruction::addImmediateOperand(local_58,3);
    spv::Instruction::addIdOperand(local_58,IVar3);
    spv::Instruction::addIdOperand(local_58,id);
    pIVar7 = local_58;
    IVar3 = makeUintConstant(this,0,false);
    spv::Instruction::addIdOperand(pIVar7,IVar3);
    local_5c = 3;
    pmVar5 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedDebugTypes,&local_5c);
    std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back
              (pmVar5,&local_58);
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_68,
               local_58);
    std::
    vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ::push_back(&this->constantsTypesGlobals,&local_68);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_68);
    Module::mapInstruction(&this->module,local_58);
    this_local._4_4_ = spv::Instruction::getResultId(local_58);
  }
  return this_local._4_4_;
}

Assistant:

Id Builder::makePointerDebugType(StorageClass storageClass, Id const baseType)
{
    const Id debugBaseType = debugId[baseType];
    if (!debugBaseType) {
        return makeDebugInfoNone();
    }
    const Id scID = makeUintConstant(storageClass);
    for (Instruction* otherType : groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypePointer]) {
        if (otherType->getIdOperand(2) == debugBaseType &&
            otherType->getIdOperand(3) == scID) {
            return otherType->getResultId();
        }
    }

    Instruction* type = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    type->reserveOperands(5);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(NonSemanticShaderDebugInfo100DebugTypePointer);
    type->addIdOperand(debugBaseType);
    type->addIdOperand(scID);
    type->addIdOperand(makeUintConstant(0));

    groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypePointer].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}